

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoder_execute
          (_func_void_ptr_size_t *alloc_fn,_func_void_void_ptr *free_fn,LossyDctEncoder *e)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  LossyDctEncoder *in_RDX;
  code *in_RSI;
  code *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  int i;
  int chan_4;
  int vy;
  int vx;
  int x_1;
  int y_1;
  int chan_3;
  float *quantTable;
  uint16_t h;
  int blockx;
  int blocky;
  int chan_2;
  float src;
  int x;
  float *srcXdr;
  int y;
  int chan_1;
  int chan;
  uint16_t *tmpHalfBufferPtr;
  uint16_t *tmpHalfBuffer;
  int tmpHalfBufferElements;
  uint16_t *currAcComp;
  uint16_t halfCoef [64];
  uint16_t halfZigCoef [64];
  int numBlocksY;
  int numBlocksX;
  DctCoderChannelData *chanData [3];
  int numComp;
  int local_1cc;
  int local_1c8;
  float in_stack_fffffffffffffe3c;
  float in_stack_fffffffffffffe40;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_194;
  int local_184;
  int local_180;
  int local_17c;
  long local_178;
  long local_170;
  int local_164;
  uint16_t *local_160;
  uint16_t local_158 [64];
  uint16_t local_d8 [48];
  float *in_stack_ffffffffffffff88;
  float *local_48 [4];
  int local_24;
  LossyDctEncoder *local_20;
  code *local_18;
  code *local_10;
  exr_result_t local_4;
  
  local_24 = in_RDX->_channel_encode_data_count;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar3 = ceilf((float)in_RDX->_width / 8.0);
  fVar4 = ceilf((float)local_20->_height / 8.0);
  local_160 = (uint16_t *)local_20->_packedAc;
  local_164 = 0;
  local_170 = 0;
  local_20->_numAcComp = 0;
  local_20->_numDcComp = 0;
  for (local_17c = 0; local_17c < local_24; local_17c = local_17c + 1) {
    local_48[local_17c] = local_20->_channel_encode_data[local_17c]->_dctData;
    if (local_48[local_17c][0x68] == 2.8026e-45) {
      local_164 = local_20->_width * local_20->_height + local_164;
    }
  }
  if ((local_164 == 0) || (local_170 = (*local_10)((long)local_164 << 1), local_170 != 0)) {
    local_178 = local_170;
    for (local_180 = 0; local_180 < local_24; local_180 = local_180 + 1) {
      if (local_48[local_180][0x68] == 2.8026e-45) {
        for (local_184 = 0; local_184 < local_20->_height; local_184 = local_184 + 1) {
          for (local_194 = 0; local_194 < local_20->_width; local_194 = local_194 + 1) {
            one_to_native_float(0.0);
            float_to_half(0.0);
            uVar2 = one_from_native16(0);
            *(uint16_t *)(local_178 + (long)local_194 * 2) = uVar2;
          }
          *(long *)(*(long *)(local_48[local_180] + 0x62) + (long)local_184 * 8) = local_178;
          local_178 = local_178 + (long)local_20->_width * 2;
        }
      }
    }
    *(uint8_t **)(local_48[0] + 0x60) = local_20->_packedDc;
    for (local_19c = 1; local_19c < local_24; local_19c = local_19c + 1) {
      *(long *)(local_48[local_19c] + 0x60) =
           *(long *)(local_48[local_19c + -1] + 0x60) + (long)((int)fVar3 * (int)fVar4) * 2;
    }
    for (local_1a0 = 0; local_1a0 < (int)fVar4; local_1a0 = local_1a0 + 1) {
      for (local_1a4 = 0; local_1a4 < (int)fVar3; local_1a4 = local_1a4 + 1) {
        for (local_1b4 = 0; local_1b4 < local_24; local_1b4 = local_1b4 + 1) {
          for (local_1b8 = 0; local_1b8 < 8; local_1b8 = local_1b8 + 1) {
            for (local_1bc = 0; local_1bc < 8; local_1bc = local_1bc + 1) {
              in_stack_fffffffffffffe40 = (float)(local_1a4 * 8 + local_1bc);
              in_stack_fffffffffffffe3c = (float)(local_1a0 * 8 + local_1b8);
              if (local_20->_width <= (int)in_stack_fffffffffffffe40) {
                in_stack_fffffffffffffe40 =
                     (float)(local_20->_width -
                            ((int)in_stack_fffffffffffffe40 - (local_20->_width + -1)));
              }
              if ((int)in_stack_fffffffffffffe40 < 0) {
                in_stack_fffffffffffffe40 = (float)(local_20->_width + -1);
              }
              if (local_20->_height <= (int)in_stack_fffffffffffffe3c) {
                in_stack_fffffffffffffe3c =
                     (float)(local_20->_height -
                            ((int)in_stack_fffffffffffffe3c - (local_20->_height + -1)));
              }
              if ((int)in_stack_fffffffffffffe3c < 0) {
                in_stack_fffffffffffffe3c = (float)(local_20->_height + -1);
              }
              if (local_20->_toNonlinear == (uint16_t *)0x0) {
                one_to_native16(0);
              }
              fVar5 = half_to_float(0);
              local_48[local_1b4][local_1b8 * 8 + local_1bc] = fVar5;
            }
          }
        }
        if (local_24 == 3) {
          csc709Forward64(local_48[0],local_48[1],local_48[2]);
        }
        for (local_1c8 = 0; local_1c8 < local_24; local_1c8 = local_1c8 + 1) {
          dctForward8x8(in_stack_ffffffffffffff88);
          for (local_1cc = 0; local_1cc < 0x40; local_1cc = local_1cc + 1) {
            uVar2 = quantize(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
            local_d8[(long)local_1cc + -0x40] = uVar2;
          }
          toZigZag(local_d8,local_158);
          priv_from_native16(local_d8,0x40);
          puVar1 = *(uint16_t **)(local_48[local_1c8] + 0x60);
          *(uint16_t **)(local_48[local_1c8] + 0x60) = puVar1 + 1;
          *puVar1 = local_d8[0];
          local_20->_numDcComp = local_20->_numDcComp + 1;
          LossyDctEncoder_rleAc(local_20,local_d8,&local_160);
        }
      }
    }
    if (local_170 != 0) {
      (*local_18)(local_170);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (
    void* (*alloc_fn) (size_t), void (*free_fn) (void*), LossyDctEncoder* e)
{
    int                  numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) (ceilf ((float) e->_width / 8.0f));
    int numBlocksY = (int) (ceilf ((float) e->_height / 8.0f));

    uint16_t halfZigCoef[64];
    uint16_t halfCoef[64];

    uint16_t* currAcComp            = (uint16_t*) e->_packedAc;
    int       tmpHalfBufferElements = 0;
    uint16_t* tmpHalfBuffer         = NULL;
    uint16_t* tmpHalfBufferPtr      = NULL;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) alloc_fn (
            (size_t) tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (int chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t     h;
            const float* quantTable;

            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            quantTable = e->_quantTableY;
            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, and zigzag
                //

                for (int i = 0; i < 64; ++i)
                {
                    halfCoef[i] =
                        quantize (chanData[chan]->_dctData[i], quantTable[i]);
                }

                toZigZag (halfZigCoef, halfCoef);

                //
                // Convert from NATIVE back to XDR, before we write out
                //
                priv_from_native16 (halfZigCoef, 64);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) free_fn (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}